

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z_libpd.c
# Opt level: O0

int libpd_sysex(int port,int byte)

{
  int byte_local;
  int port_local;
  
  if ((port < 0) || (0xfff < port)) {
    byte_local = -1;
  }
  else if ((byte < 0) || (0xff < byte)) {
    byte_local = -1;
  }
  else {
    sys_lock();
    inmidi_sysex(port,byte);
    sys_unlock();
    byte_local = 0;
  }
  return byte_local;
}

Assistant:

int libpd_sysex(int port, int byte) {
  CHECK_PORT
  CHECK_RANGE_8BIT(byte)
  sys_lock();
  inmidi_sysex(port, byte);
  sys_unlock();
  return 0;
}